

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int uv_tty_get_winsize(uv_tty_t *tty,int *width,int *height)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  ushort local_30;
  ushort local_2e;
  int err;
  winsize ws;
  int *height_local;
  int *width_local;
  uv_tty_t *tty_local;
  
  ws = (winsize)height;
  do {
    iVar1 = ioctl((tty->io_watcher).fd,0x5413,&local_30);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    tty_local._4_4_ = -*piVar2;
  }
  else {
    *width = (uint)local_2e;
    *(uint *)ws = (uint)local_30;
    tty_local._4_4_ = 0;
  }
  return tty_local._4_4_;
}

Assistant:

int uv_tty_get_winsize(uv_tty_t* tty, int* width, int* height) {
  struct winsize ws;
  int err;

  do
    err = ioctl(uv__stream_fd(tty), TIOCGWINSZ, &ws);
  while (err == -1 && errno == EINTR);

  if (err == -1)
    return UV__ERR(errno);

  *width = ws.ws_col;
  *height = ws.ws_row;

  return 0;
}